

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

int lyd_lyb_data_length(char *data)

{
  int iVar1;
  int iVar2;
  ly_in *in;
  bool bVar3;
  LY_ERR LVar4;
  lylyb_ctx *lybctx;
  int iVar5;
  ly_in **in_00;
  uint8_t zero [2];
  uint8_t buf [65535];
  uint8_t auStack_10038 [65544];
  
  if (data == (char *)0x0) {
    return -1;
  }
  lybctx = (lylyb_ctx *)calloc(1,0x38);
  if (lybctx == (lylyb_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_lyb_data_length");
    return 1;
  }
  in_00 = &lybctx->in;
  LVar4 = ly_in_new_memory(data,in_00);
  if (((LVar4 == LY_SUCCESS) && (LVar4 = lyb_parse_magic_number(lybctx), LVar4 == LY_SUCCESS)) &&
     (LVar4 = lyb_parse_header(lybctx), LVar4 == LY_SUCCESS)) {
    lyb_read(auStack_10038,2,lybctx);
    if (*(short *)(*in_00)->current == 0) {
      lyb_read((uint8_t *)0x0,2,lybctx);
LAB_00139215:
      ly_in_skip(*in_00,1);
      bVar3 = true;
      goto LAB_0013909f;
    }
    LVar4 = lyb_read_start_siblings(lybctx);
    if (LVar4 == LY_SUCCESS) {
      lyb_skip_siblings(lybctx);
      LVar4 = lyb_read_stop_siblings(lybctx);
      if (LVar4 == LY_SUCCESS) goto LAB_00139215;
    }
  }
  bVar3 = false;
LAB_0013909f:
  in = lybctx->in;
  iVar1 = *(int *)&in->current;
  iVar2 = *(int *)&in->start;
  ly_in_free(in,'\0');
  lylyb_ctx_free(lybctx);
  iVar5 = -1;
  if (bVar3) {
    iVar5 = iVar1 - iVar2;
  }
  return iVar5;
}

Assistant:

LIBYANG_API_DEF int
lyd_lyb_data_length(const char *data)
{
    LY_ERR ret = LY_SUCCESS;
    struct lylyb_ctx *lybctx;
    uint32_t count, feat_count, len = 0, i, j;
    uint8_t buf[LYB_SIZE_MAX];
    uint8_t zero[LYB_SIZE_BYTES] = {0};

    if (!data) {
        return -1;
    }

    lybctx = calloc(1, sizeof *lybctx);
    LY_CHECK_ERR_RET(!lybctx, LOGMEM(NULL), LY_EMEM);
    ret = ly_in_new_memory(data, &lybctx->in);
    LY_CHECK_GOTO(ret, cleanup);

    /* read magic number */
    ret = lyb_parse_magic_number(lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* read header */
    ret = lyb_parse_header(lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* read model count */
    lyb_read_number(&count, sizeof count, 2, lybctx);

    /* read all models */
    for (i = 0; i < count; ++i) {
        /* module name length */
        lyb_read_number(&len, sizeof len, 2, lybctx);

        /* model name */
        lyb_read(buf, len, lybctx);

        /* revision */
        lyb_read(buf, 2, lybctx);

        /* enabled feature count */
        lyb_read_number(&feat_count, sizeof feat_count, 2, lybctx);

        /* enabled features */
        for (j = 0; j < feat_count; ++j) {
            /* feature name length */
            lyb_read_number(&len, sizeof len, 2, lybctx);

            /* feature name */
            lyb_read(buf, len, lybctx);
        }
    }

    if (memcmp(zero, lybctx->in->current, LYB_SIZE_BYTES)) {
        /* register a new sibling */
        ret = lyb_read_start_siblings(lybctx);
        LY_CHECK_GOTO(ret, cleanup);

        /* skip it */
        lyb_skip_siblings(lybctx);

        /* sibling finished */
        ret = lyb_read_stop_siblings(lybctx);
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        lyb_read(NULL, LYB_SIZE_BYTES, lybctx);
    }

    /* read the last zero, parsing finished */
    ly_in_skip(lybctx->in, 1);

cleanup:
    count = lybctx->in->current - lybctx->in->start;

    ly_in_free(lybctx->in, 0);
    lylyb_ctx_free(lybctx);

    return ret ? -1 : (int)count;
}